

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O2

bool __thiscall GetNameTest::DoTest(GetNameTest *this)

{
  size_t sVar1;
  char *__s;
  GetNameTest *this_00;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  size_t __n;
  DnsStats *this_01;
  size_t i;
  ulong uVar5;
  char **ppcVar6;
  bool bVar7;
  size_t name_length;
  char name_out [1024];
  size_t local_448;
  GetNameTest *local_440;
  uint8_t local_438 [1032];
  
  pFVar4 = ithi_file_open("getname-out.txt","w");
  this->test_out = pFVar4;
  bVar7 = pFVar4 != (FILE *)0x0;
  ppcVar6 = &getNameTestData[0].expected;
  local_440 = this;
  for (uVar5 = 0; (this_00 = local_440, bVar7 != false && (uVar5 < 9)); uVar5 = uVar5 + 1) {
    local_448 = 0;
    sVar1 = (size_t)ppcVar6[-1];
    iVar3 = DnsStats::GetDnsName
                      (((st_getNameTestLine *)(ppcVar6 + -2))->dns,(uint32_t)sVar1,0,local_438,0x400
                       ,&local_448);
    bVar2 = false;
    if (sVar1 == (long)iVar3) {
      __s = *ppcVar6;
      __n = strlen(__s);
      if (__n == local_448) {
        iVar3 = bcmp(__s,local_438,__n);
        bVar2 = bVar7;
        if (iVar3 != 0) {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
    }
    bVar7 = bVar2;
    ppcVar6 = ppcVar6 + 3;
  }
  if (bVar7 != false) {
    this_01 = (DnsStats *)operator_new(0x1e0);
    DnsStats::DnsStats(this_01);
    this_00->stats = this_01;
    bVar7 = LoadPcapFile(this_00,"data/tiny-capture.pcap");
  }
  if ((FILE *)this_00->test_out != (FILE *)0x0) {
    fclose((FILE *)this_00->test_out);
    this_00->test_out = (FILE *)0x0;
  }
  if (bVar7 == false) {
    bVar7 = false;
  }
  else {
    bVar7 = MetricTest::compare_files("getname-out.txt","data/getname-test.txt");
  }
  return bVar7;
}

Assistant:

bool GetNameTest::DoTest()
{
    bool ret = true;

    test_out = ithi_file_open(getname_test_debug, "w");
    ret = (test_out != NULL);

    for (size_t i = 0; ret && i < sizeof(getNameTestData) / sizeof(struct st_getNameTestLine); i++) {
        char name_out[1024];
        size_t name_length = 0;
        size_t next = 0;

        next = DnsStats::GetDnsName(getNameTestData[i].dns, (uint32_t)getNameTestData[i].dns_length, 0, (uint8_t *)name_out, sizeof(name_out), &name_length);

        if (next != getNameTestData[i].dns_length) {
            ret = false;
        } else  if (strlen(getNameTestData[i].expected) != name_length) {
            ret = false;
        } else if (memcmp(getNameTestData[i].expected, name_out, name_length) != 0) {
            ret = false;
        }
    }


    if (ret) {
        stats = new DnsStats();

        if (stats == NULL) {
            ret = false;
        }
    }

    if (ret) {
        ret = LoadPcapFile(getname_input_test);
    }

    if (test_out != NULL) {
        fclose(test_out);
        test_out = NULL;
    }

    if (ret) {
        ret = MetricTest::compare_files(getname_test_debug, getname_test_output);
    }

    return ret;
}